

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O1

id_type __thiscall
Darts::Details::DawgBuilder::find_node(DawgBuilder *this,id_type node_id,id_type *hash_id)

{
  int *piVar1;
  ulong uVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  id_type iVar8;
  uint uVar9;
  ulong uVar10;
  id_type iVar11;
  int *in_R8;
  uint uVar12;
  bool bVar13;
  char cVar14;
  
  if (node_id == 0) {
    uVar7 = 0;
  }
  else {
    uVar7 = 0;
    uVar12 = node_id;
    do {
      in_R8 = (int *)((this->nodes_).buf_.array_ + (ulong)uVar12 * 0xc);
      if (*(byte *)(in_R8 + 2) == 0) {
        uVar12 = *in_R8 * 2;
      }
      else {
        uVar12 = *in_R8 * 4 + (uint)*(byte *)((long)in_R8 + 9) * 2;
      }
      uVar12 = *(byte *)((long)in_R8 + 10) | uVar12;
      uVar12 = uVar12 * 0x8000 + ~((uint)*(byte *)(in_R8 + 2) << 0x18 ^ uVar12);
      uVar12 = (uVar12 >> 0xc ^ uVar12) * 5;
      uVar12 = (uVar12 >> 4 ^ uVar12) * 0x809;
      uVar7 = uVar7 ^ uVar12 ^ uVar12 >> 0x10;
      uVar12 = in_R8[1];
    } while (uVar12 != 0);
  }
  uVar2 = (this->table_).size_;
  pcVar3 = (this->table_).buf_.array_;
  pcVar4 = (this->nodes_).buf_.array_;
  pcVar5 = (this->units_).buf_.array_;
  do {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar2;
    iVar8 = SUB164(ZEXT416(uVar7) % auVar6,0);
    *hash_id = iVar8;
    uVar7 = *(uint *)(pcVar3 + SUB168(ZEXT416(uVar7) % auVar6,0) * 4);
    if ((ulong)uVar7 == 0) {
      cVar14 = '\x02';
    }
    else {
      uVar12 = *(uint *)(pcVar4 + (ulong)node_id * 0xc + 4);
      uVar9 = uVar7;
      if (uVar12 == 0) {
LAB_001f37ba:
        cVar14 = node_id == 0 && (*(uint *)(pcVar5 + (ulong)uVar9 * 4) & 1) == 0;
        if ((node_id != 0) && ((*(uint *)(pcVar5 + (ulong)uVar9 * 4) & 1) == 0)) {
          cVar14 = false;
          uVar10 = (ulong)node_id;
          do {
            piVar1 = (int *)(pcVar4 + uVar10 * 0xc);
            if ((char)piVar1[2] == '\0') {
              uVar12 = *piVar1 * 2;
            }
            else {
              uVar12 = *piVar1 * 4 + (uint)*(byte *)((long)piVar1 + 9) * 2;
            }
            if (((*(byte *)((long)piVar1 + 10) | uVar12) != *(uint *)(pcVar5 + (ulong)uVar9 * 4)) ||
               ((char)piVar1[2] != (this->labels_).buf_.array_[uVar9])) break;
            uVar10 = (ulong)(uint)piVar1[1];
            uVar9 = uVar9 - 1;
            cVar14 = piVar1[1] == 0;
          } while (!(bool)cVar14);
        }
      }
      else {
        if ((pcVar5[(ulong)uVar7 * 4] & 1U) == 0) {
          bVar13 = false;
        }
        else {
          do {
            uVar9 = uVar9 + 1;
            uVar12 = *(uint *)(pcVar4 + (ulong)uVar12 * 0xc + 4);
            bVar13 = uVar12 == 0;
            if (bVar13) goto LAB_001f37ba;
          } while ((pcVar5[(ulong)uVar9 * 4] & 1U) != 0);
        }
        if (bVar13) goto LAB_001f37ba;
        cVar14 = false;
      }
      in_R8 = (int *)((ulong)in_R8 & 0xffffffff);
      if ((bool)cVar14) {
        in_R8 = (int *)(ulong)uVar7;
      }
    }
    iVar11 = (id_type)in_R8;
    if (cVar14 != '\0') {
      if (cVar14 != '\x01') {
        iVar11 = 0;
      }
      return iVar11;
    }
    uVar7 = iVar8 + 1;
  } while( true );
}

Assistant:

inline id_type DawgBuilder::find_node(id_type node_id,
    id_type *hash_id) const {
  *hash_id = hash_node(node_id) % table_.size();
  for ( ; ; *hash_id = (*hash_id + 1) % table_.size()) {
    id_type unit_id = table_[*hash_id];
    if (unit_id == 0) {
      break;
    }

    if (are_equal(node_id, unit_id)) {
      return unit_id;
    }
  }
  return 0;
}